

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

void cpprofiler::MessageMarshalling::serialize(vector<char,_std::allocator<char>_> *data,string *s)

{
  pointer *ppcVar1;
  size_type sVar2;
  pointer pcVar3;
  iterator __position;
  size_type sVar4;
  char c;
  char local_29;
  
  serialize(data,(int32_t)s->_M_string_length);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      local_29 = pcVar3[sVar4];
      __position._M_current =
           (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)data,__position,&local_29);
      }
      else {
        *__position._M_current = local_29;
        ppcVar1 = &(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

static void serialize(std::vector<char>& data, const std::string& s) {
    serialize(data, static_cast<int32_t>(s.size()));
    for (char c : s) {
      data.push_back(c);
    }
  }